

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall slang::ast::Compilation::elaborate(Compilation *this)

{
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL> protos;
  span<const_std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_18446744073709551615UL>
  modports;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  LookupLocation location;
  string_view name_00;
  bool bVar1;
  undefined1 uVar2;
  reference ppSVar3;
  reference ppVar4;
  reference ppSVar5;
  Scope *this_00;
  reference ppCVar6;
  RootSymbol *pRVar7;
  reference ppIVar8;
  reference ppSVar9;
  reference ppDVar10;
  equal_to<const_slang::ast::DefinitionSymbol_*> *this_01;
  DefinitionSymbol **ppDVar11;
  long in_RDI;
  SourceRange SVar12;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> sVar13;
  Compilation *in_stack_00000090;
  span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL> in_stack_00000098;
  DefinitionSymbol *def;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  *__range2_1;
  vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  newUnreferencedDefs;
  ArgumentDirection dir;
  Symbol *port;
  iterator __end4_1;
  iterator __begin4_1;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *__range4_1;
  InstanceSymbol *inst;
  iterator __end3_4;
  iterator __begin3_4;
  span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL> *__range3_4;
  ConfigBlockSymbol *config;
  iterator __end4;
  iterator __begin4;
  type *__range4;
  type *confList;
  type *name_1;
  iterator __end3_3;
  iterator __begin3_3;
  flat_hash_map<std::string_view,_std::vector<const_ConfigBlockSymbol_*>_> *__range3_3;
  Diagnostic *diag_1;
  Diagnostic *diag;
  Symbol *sym;
  SourceRange classRange;
  type *scope_2;
  type *declName;
  type *className;
  type_conflict2 *used;
  type *index;
  type *name;
  type *syntax;
  type *val;
  type *key;
  iterator __end3_2;
  iterator __begin3_2;
  flat_hash_map<std::tuple<std::string_view,_std::string_view,_const_Scope_*>,_std::tuple<const_syntax::SyntaxNode_*,_const_syntax::ScopedNameSyntax_*,_SymbolIndex,_bool>_>
  *__range3_2;
  flat_hash_map<std::tuple<std::string_view,_std::string_view,_const_Scope_*>,_std::tuple<const_syntax::SyntaxNode_*,_const_syntax::ScopedNameSyntax_*,_SymbolIndex,_bool>_>
  decls;
  Scope *scope_1;
  Symbol *symbol;
  iterator __end3_1;
  iterator __begin3_1;
  vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *__range3_1;
  vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> conflicts;
  ResolvedBind resolvedBind;
  type *scope;
  type *directive;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
  *__range2;
  SubroutineSymbol *method;
  iterator __end3;
  iterator __begin3;
  vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  *__range3;
  vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  methods;
  DiagnosticVisitor elabVisitor;
  uint32_t errorLimit;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  SourceLocation in_stack_fffffffffffff748;
  SourceLocation in_stack_fffffffffffff750;
  DiagnosticVisitor *in_stack_fffffffffffff758;
  undefined7 in_stack_fffffffffffff760;
  undefined1 in_stack_fffffffffffff767;
  size_type in_stack_fffffffffffff778;
  vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  *in_stack_fffffffffffff780;
  undefined7 in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff78f;
  Diagnostic *in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff798;
  undefined4 uVar14;
  uint32_t in_stack_fffffffffffff79c;
  undefined4 uVar15;
  SyntaxNode *in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7ac;
  DiagnosticVisitor *in_stack_fffffffffffff7b0;
  undefined1 *puVar16;
  Compilation *in_stack_fffffffffffff7e0;
  ResolvedBind *in_stack_fffffffffffff7e8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff7f0;
  SourceLocation in_stack_fffffffffffff7f8;
  Compilation *in_stack_fffffffffffff800;
  DiagCode code;
  Compilation *in_stack_fffffffffffff810;
  pointer in_stack_fffffffffffff818;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff820;
  undefined7 in_stack_fffffffffffff890;
  SourceLocation in_stack_fffffffffffff898;
  BindDirectiveSyntax **in_stack_fffffffffffff8a0;
  DefinitionSymbol *local_710;
  DefinitionSymbol **local_708;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  local_700;
  long local_6f8;
  size_t local_6d8;
  char *pcStack_6d0;
  size_t local_6c8;
  char *pcStack_6c0;
  SourceLocation local_6b8;
  undefined4 local_6ac;
  size_t local_6a8;
  char *pcStack_6a0;
  SourceLocation local_698;
  undefined4 local_690;
  ArgumentDirection local_68c;
  size_t local_688;
  char *pcStack_680;
  size_t local_678;
  char *pcStack_670;
  SourceLocation local_660;
  undefined4 local_654;
  Symbol *local_650;
  Symbol **local_648;
  __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
  local_640;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> local_638;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *local_628;
  InstanceSymbol *local_620;
  InstanceSymbol **local_618;
  __normal_iterator<const_slang::ast::InstanceSymbol_*const_*,_std::span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>_>
  local_610;
  span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL> *local_608;
  bitmask<slang::ast::CompilationFlags> local_5fc;
  ConfigBlockSymbol *local_5f8;
  ConfigBlockSymbol **local_5f0;
  __normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
  local_5e8;
  type *local_5e0;
  type *local_5d8;
  type *local_5d0;
  reference local_5c8;
  iterator local_5c0;
  iterator local_5b0;
  SubroutineSymbol *in_stack_fffffffffffffa60;
  DiagnosticVisitor *in_stack_fffffffffffffa98;
  char *in_stack_fffffffffffffaa0;
  Scope *in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  size_t in_stack_fffffffffffffab8;
  SourceLocation in_stack_fffffffffffffac0;
  SourceLocation in_stack_fffffffffffffae0;
  LookupLocation local_508;
  size_t local_4f8;
  char *pcStack_4f0;
  Symbol *local_4e0;
  SourceRange local_4d8;
  __tuple_element_t<2UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_const_Scope_*>_>
  *local_4c8;
  __tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_const_Scope_*>_>
  *local_4c0;
  __tuple_element_t<0UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_const_Scope_*>_>
  *local_4b8;
  type *local_4b0;
  __tuple_element_t<3UL,_tuple<const_SyntaxNode_*,_const_ScopedNameSyntax_*,_SymbolIndex,_bool>_>
  *local_4a8;
  __tuple_element_t<2UL,_tuple<const_SyntaxNode_*,_const_ScopedNameSyntax_*,_SymbolIndex,_bool>_>
  *local_4a0;
  __tuple_element_t<1UL,_tuple<const_SyntaxNode_*,_const_ScopedNameSyntax_*,_SymbolIndex,_bool>_>
  *local_498;
  __tuple_element_t<0UL,_tuple<const_SyntaxNode_*,_const_ScopedNameSyntax_*,_SymbolIndex,_bool>_>
  *local_490;
  type *local_488;
  type *local_480;
  type *local_478;
  reference local_470;
  iterator local_468;
  iterator local_458;
  undefined1 *local_448;
  undefined1 local_440 [48];
  SourceLocation local_410;
  Symbol *local_408;
  Symbol **local_400;
  __normal_iterator<const_slang::ast::Symbol_**,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>
  local_3f8;
  undefined1 *local_3f0;
  undefined1 local_3e8 [128];
  type *local_368;
  type *local_360;
  BindDirectiveSyntax *local_358;
  Scope *pSStack_350;
  pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*> *local_340;
  __normal_iterator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>_>
  local_338;
  long local_330;
  SubroutineSymbol *local_308;
  SubroutineSymbol **local_300;
  __normal_iterator<const_slang::ast::SubroutineSymbol_**,_std::vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>_>
  local_2f8;
  undefined1 *local_2f0;
  undefined1 local_2e8 [40];
  undefined4 local_2c0;
  undefined1 local_238 [112];
  SmallVectorBase<const_slang::ast::SubroutineSymbol_*> local_1c8 [2];
  SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> local_188 [2];
  ResolvedBind *in_stack_fffffffffffffec8;
  Scope *in_stack_fffffffffffffed0;
  BindDirectiveSyntax *in_stack_fffffffffffffed8;
  Compilation *in_stack_fffffffffffffee0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::DefinitionSymbol_*>
  local_b0;
  DefinitionSymbol **local_98;
  undefined1 *local_90;
  iterator local_88;
  size_t local_78;
  DefinitionSymbol **local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  DefinitionSymbol **local_10;
  undefined1 *local_8;
  
  DiagnosticVisitor::DiagnosticVisitor
            (in_stack_fffffffffffff7b0,
             (Compilation *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
             (size_t *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c);
  getRoot((Compilation *)0x623350);
  Symbol::visit<slang::ast::DiagnosticVisitor&>
            ((Symbol *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
             in_stack_fffffffffffff758);
  bVar1 = DiagnosticVisitor::finishedEarly((DiagnosticVisitor *)&stack0xfffffffffffffd50);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x4dc) = 1;
    local_2c0 = 1;
  }
  else {
    DiagnosticVisitor::finalize(in_stack_fffffffffffffa98);
    bVar1 = std::
            vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
            ::empty((vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
                     *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
    if ((!bVar1) ||
       (bVar1 = SmallVectorBase<const_slang::ast::SubroutineSymbol_*>::empty(local_1c8), !bVar1)) {
      std::span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL>::
      span<slang::SmallVector<const_slang::ast::SubroutineSymbol_*,_5UL>_&>
                ((span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL> *)
                 CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                 (SmallVector<const_slang::ast::SubroutineSymbol_*,_5UL> *)in_stack_fffffffffffff758
                );
      checkDPIMethods(in_stack_00000090,in_stack_00000098);
    }
    bVar1 = std::
            vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
            ::empty((vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                     *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
    if (!bVar1) {
      std::
      vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
      ::vector((vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                *)in_stack_fffffffffffff7a0,
               (vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
      local_2f0 = local_2e8;
      local_2f8._M_current =
           (SubroutineSymbol **)
           std::
           vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
           ::begin((vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                    *)in_stack_fffffffffffff748);
      local_300 = (SubroutineSymbol **)
                  std::
                  vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                  ::end((vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                         *)in_stack_fffffffffffff748);
      while (bVar1 = __gnu_cxx::
                     operator==<const_slang::ast::SubroutineSymbol_**,_std::vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>_>
                               ((__normal_iterator<const_slang::ast::SubroutineSymbol_**,_std::vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>_>
                                 *)in_stack_fffffffffffff750,
                                (__normal_iterator<const_slang::ast::SubroutineSymbol_**,_std::vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>_>
                                 *)in_stack_fffffffffffff748), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppSVar3 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::SubroutineSymbol_**,_std::vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>_>
                  ::operator*(&local_2f8);
        local_308 = *ppSVar3;
        SubroutineSymbol::connectExternInterfacePrototype(in_stack_fffffffffffffa60);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::SubroutineSymbol_**,_std::vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>_>
        ::operator++(&local_2f8);
      }
      std::
      vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
      ::~vector((vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                 *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
    }
    bVar1 = SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>::empty(local_188);
    if (!bVar1) {
      std::span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL>::
      span<slang::SmallVector<const_slang::ast::MethodPrototypeSymbol_*,_5UL>_&>
                ((span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL> *)
                 CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                 (SmallVector<const_slang::ast::MethodPrototypeSymbol_*,_5UL> *)
                 in_stack_fffffffffffff758);
      protos._M_extent._M_extent_value = in_stack_fffffffffffff7f0._M_extent_value;
      protos._M_ptr = (pointer)in_stack_fffffffffffff7e8;
      checkExternIfaceMethods(in_stack_fffffffffffff7e0,protos);
    }
    bVar1 = SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
            ::empty((SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
                     *)&stack0xfffffffffffffeb8);
    if (!bVar1) {
      std::
      span<const_std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_18446744073709551615UL>
      ::
      span<slang::SmallVector<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_2UL>_&>
                ((span<const_std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_18446744073709551615UL>
                  *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                 (SmallVector<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_2UL>
                  *)in_stack_fffffffffffff758);
      modports._M_extent._M_extent_value = in_stack_fffffffffffff820._M_extent_value;
      modports._M_ptr = in_stack_fffffffffffff818;
      checkModportExports(in_stack_fffffffffffff810,modports);
    }
    local_330 = in_RDI + 0xa08;
    local_338._M_current =
         (pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*> *)
         std::
         vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
         ::begin((vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                  *)in_stack_fffffffffffff748);
    local_340 = (pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*> *)
                std::
                vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                ::end((vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                       *)in_stack_fffffffffffff748);
    while (bVar1 = __gnu_cxx::
                   operator==<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>_>
                             ((__normal_iterator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>_>
                               *)in_stack_fffffffffffff750,
                              (__normal_iterator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>_>
                               *)in_stack_fffffffffffff748), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar4 = __gnu_cxx::
               __normal_iterator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>_>
               ::operator*(&local_338);
      local_358 = ppVar4->first;
      pSStack_350 = ppVar4->second;
      in_stack_fffffffffffff8a0 = &local_358;
      local_360 = std::get<0ul,slang::syntax::BindDirectiveSyntax_const*,slang::ast::Scope_const*>
                            ((pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>
                              *)0x623668);
      local_368 = std::get<1ul,slang::syntax::BindDirectiveSyntax_const*,slang::ast::Scope_const*>
                            ((pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>
                              *)0x62367d);
      ResolvedBind::ResolvedBind((ResolvedBind *)in_stack_fffffffffffff750);
      resolveBindTargets(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      checkBindTargetParams
                (in_stack_fffffffffffff800,(BindDirectiveSyntax *)in_stack_fffffffffffff7f8,
                 (Scope *)in_stack_fffffffffffff7f0._M_extent_value,in_stack_fffffffffffff7e8);
      ResolvedBind::~ResolvedBind((ResolvedBind *)0x623701);
      __gnu_cxx::
      __normal_iterator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_*,_std::vector<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>_>
      ::operator++(&local_338);
    }
    bVar1 = std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::
            empty((vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *
                  )CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
    if (!bVar1) {
      std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::vector
                ((vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *)
                 in_stack_fffffffffffff7a0,
                 (vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *)
                 CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
      local_3f0 = local_3e8;
      local_3f8._M_current =
           (Symbol **)
           std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::
           begin((vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *)
                 in_stack_fffffffffffff748);
      local_400 = (Symbol **)
                  std::
                  vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::
                  end((vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
                       *)in_stack_fffffffffffff748);
      while (bVar1 = __gnu_cxx::
                     operator==<const_slang::ast::Symbol_**,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>
                               ((__normal_iterator<const_slang::ast::Symbol_**,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>
                                 *)in_stack_fffffffffffff750,
                                (__normal_iterator<const_slang::ast::Symbol_**,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>
                                 *)in_stack_fffffffffffff748), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppSVar5 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::Symbol_**,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>
                  ::operator*(&local_3f8);
        local_408 = *ppSVar5;
        in_stack_fffffffffffff898 = (SourceLocation)Symbol::getParentScope(local_408);
        local_410 = in_stack_fffffffffffff898;
        Scope::handleNameConflict
                  ((Scope *)in_stack_fffffffffffff790,
                   (Symbol *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788));
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Symbol_**,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>
        ::operator++(&local_3f8);
      }
      std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::~vector
                ((vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *)
                 CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
    }
    bVar1 = boost::unordered::
            unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
            ::empty((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                     *)0x623882);
    if (!bVar1) {
      boost::unordered::
      unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
      ::unordered_flat_map
                ((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                  *)in_stack_fffffffffffff750,
                 (unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                  *)in_stack_fffffffffffff748);
      local_448 = local_440;
      local_458 = boost::unordered::
                  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                  ::begin((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                           *)0x6238c5);
      local_468 = boost::unordered::
                  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                  ::end((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                         *)0x6238e2);
      while( true ) {
        uVar2 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_fffffffffffff750,
                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_fffffffffffff748);
        if (!(bool)uVar2) break;
        local_470 = boost::unordered::detail::foa::
                    table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                 *)0x62392d);
        local_478 = std::
                    get<0ul,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>
                              ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
                                *)0x623942);
        local_488 = std::
                    get<1ul,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>
                              ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
                                *)0x623957);
        local_480 = local_488;
        local_490 = std::
                    get<0ul,slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>
                              ((tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                *)0x62397c);
        local_498 = std::
                    get<1ul,slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>
                              ((tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                *)0x623991);
        local_4a0 = std::
                    get<2ul,slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>
                              ((tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                *)0x6239a6);
        local_4a8 = std::
                    get<3ul,slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>
                              ((tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                *)0x6239bb);
        if ((*local_4a8 & 1U) == 0) {
          local_4b0 = local_478;
          local_4b8 = std::
                      get<0ul,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>
                                ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                  *)0x6239f1);
          local_4c0 = std::
                      get<1ul,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>
                                ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                  *)0x623a06);
          local_4c8 = std::
                      get<2ul,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>
                                ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                  *)0x623a1b);
          this_00 = (Scope *)not_null<slang::syntax::NameSyntax_*>::operator->
                                       ((not_null<slang::syntax::NameSyntax_*> *)0x623a37);
          SVar12 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff7a0);
          local_4f8 = local_4b8->_M_len;
          pcStack_4f0 = local_4b8->_M_str;
          local_4d8 = SVar12;
          LookupLocation::LookupLocation(&local_508,*local_4c8,*local_4a0);
          in_stack_fffffffffffff750 = local_4d8.endLoc;
          in_stack_fffffffffffff748 = local_4d8.startLoc;
          bitmask<slang::ast::LookupFlags>::bitmask
                    ((bitmask<slang::ast::LookupFlags> *)&stack0xfffffffffffffae4,None);
          name_00._M_str = (char *)in_stack_fffffffffffffac0;
          name_00._M_len = in_stack_fffffffffffffab8;
          location._8_8_ = in_stack_fffffffffffffab0;
          location.scope = in_stack_fffffffffffffaa8;
          SVar12.endLoc = in_stack_fffffffffffff748;
          SVar12.startLoc = in_stack_fffffffffffffae0;
          local_4e0 = Lookup::unqualifiedAt
                                ((Scope *)in_stack_fffffffffffffa98,name_00,location,SVar12,
                                 (bitmask<slang::ast::LookupFlags>)
                                 (underlying_type)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          if (local_4e0 != (Symbol *)0x0) {
            bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_4c0);
            if (!bVar1) {
              bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_4b8);
              if (!bVar1) {
                if ((local_4e0->kind == ClassType) || (local_4e0->kind == GenericClassDef)) {
                  SVar12 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff7a0);
                  in_stack_fffffffffffffac0 = SVar12.startLoc;
                  sourceRange.startLoc._7_1_ = uVar2;
                  sourceRange.startLoc._0_7_ = in_stack_fffffffffffff890;
                  sourceRange.endLoc = in_stack_fffffffffffff898;
                  Scope::addDiag(this_00,SUB84((ulong)in_stack_fffffffffffff8a0 >> 0x20,0),
                                 sourceRange);
                  in_stack_fffffffffffffaa8 = (Scope *)local_4c0->_M_len;
                  in_stack_fffffffffffffab0 = local_4c0->_M_str;
                  arg._M_len._4_4_ = in_stack_fffffffffffff79c;
                  arg._M_len._0_4_ = in_stack_fffffffffffff798;
                  arg._M_str = (char *)in_stack_fffffffffffff7a0;
                  Diagnostic::operator<<(in_stack_fffffffffffff790,arg);
                  in_stack_fffffffffffffa98 = (DiagnosticVisitor *)local_4b8->_M_len;
                  in_stack_fffffffffffffaa0 = local_4b8->_M_str;
                  arg_00._M_len._4_4_ = in_stack_fffffffffffff79c;
                  arg_00._M_len._0_4_ = in_stack_fffffffffffff798;
                  arg_00._M_str = (char *)in_stack_fffffffffffff7a0;
                  Diagnostic::operator<<(in_stack_fffffffffffff790,arg_00);
                }
                else {
                  sourceRange_00.startLoc._7_1_ = uVar2;
                  sourceRange_00.startLoc._0_7_ = in_stack_fffffffffffff890;
                  sourceRange_00.endLoc = in_stack_fffffffffffff898;
                  Scope::addDiag(this_00,SUB84((ulong)in_stack_fffffffffffff8a0 >> 0x20,0),
                                 sourceRange_00);
                  arg_01._M_len._4_4_ = in_stack_fffffffffffff79c;
                  arg_01._M_len._0_4_ = in_stack_fffffffffffff798;
                  arg_01._M_str = (char *)in_stack_fffffffffffff7a0;
                  Diagnostic::operator<<(in_stack_fffffffffffff790,arg_01);
                }
              }
            }
          }
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffff750);
      }
      boost::unordered::
      unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
      ::~unordered_flat_map
                ((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                  *)0x623d87);
    }
    bVar1 = boost::unordered::
            unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
            ::empty((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                     *)0x623d9b);
    if (!bVar1) {
      local_5b0 = boost::unordered::
                  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                  ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                           *)0x623dc6);
      local_5c0 = boost::unordered::
                  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                  ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                         *)0x623de3);
      while( true ) {
        bVar1 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_fffffffffffff750,
                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_fffffffffffff748);
        if (!bVar1) break;
        local_5c8 = boost::unordered::detail::foa::
                    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                 *)0x623e2e);
        local_5d0 = std::
                    get<0ul,std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>
                              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                                *)0x623e43);
        local_5e0 = std::
                    get<1ul,std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>
                              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                                *)0x623e58);
        local_5d8 = local_5e0;
        local_5e8._M_current =
             (ConfigBlockSymbol **)
             std::
             vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
             ::begin((vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                      *)in_stack_fffffffffffff748);
        local_5f0 = (ConfigBlockSymbol **)
                    std::
                    vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                    ::end((vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                           *)in_stack_fffffffffffff748);
        while( true ) {
          bVar1 = __gnu_cxx::
                  operator==<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                            ((__normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                              *)in_stack_fffffffffffff750,
                             (__normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                              *)in_stack_fffffffffffff748);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          ppCVar6 = __gnu_cxx::
                    __normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                    ::operator*(&local_5e8);
          local_5f8 = *ppCVar6;
          if ((local_5f8->isUsed & 1U) != 0) {
            ConfigBlockSymbol::checkUnusedRules((ConfigBlockSymbol *)in_stack_fffffffffffff810);
          }
          __gnu_cxx::
          __normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
          ::operator++(&local_5e8);
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffff750);
      }
    }
    bitmask<slang::ast::CompilationFlags>::bitmask(&local_5fc,AllowTopLevelIfacePorts);
    bVar1 = hasFlag((Compilation *)in_stack_fffffffffffff748,
                    (bitmask<slang::ast::CompilationFlags>)in_stack_fffffffffffff750._4_4_);
    if (!bVar1) {
      pRVar7 = getRoot((Compilation *)0x623f62);
      local_608 = &pRVar7->topInstances;
      local_610._M_current =
           (InstanceSymbol **)
           std::span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL> *)
                      in_stack_fffffffffffff748);
      local_618 = (InstanceSymbol **)
                  std::span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>::end
                            ((span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>
                              *)in_stack_fffffffffffff758);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_slang::ast::InstanceSymbol_*const_*,_std::span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::InstanceSymbol_*const_*,_std::span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffff750,
                           (__normal_iterator<const_slang::ast::InstanceSymbol_*const_*,_std::span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffff748);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        ppIVar8 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::InstanceSymbol_*const_*,_std::span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>_>
                  ::operator*(&local_610);
        local_620 = *ppIVar8;
        sVar13 = InstanceBodySymbol::getPortList((InstanceBodySymbol *)in_stack_fffffffffffff748);
        local_628 = &local_638;
        local_638 = sVar13;
        local_640._M_current =
             (Symbol **)
             std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                        in_stack_fffffffffffff748);
        local_648 = (Symbol **)
                    std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::end
                              ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                               in_stack_fffffffffffff758);
        while( true ) {
          bVar1 = __gnu_cxx::
                  operator==<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                            ((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                              *)in_stack_fffffffffffff750,
                             (__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                              *)in_stack_fffffffffffff748);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          ppSVar9 = __gnu_cxx::
                    __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                    ::operator*(&local_640);
          local_650 = *ppSVar9;
          if (local_650->kind == InterfacePort) {
            local_654 = 0x1d000d;
            local_660 = local_650->location;
            Scope::addDiag((Scope *)in_stack_fffffffffffff7f0._M_extent_value,
                           SUB84((ulong)in_stack_fffffffffffff800 >> 0x20,0),
                           in_stack_fffffffffffff7f8);
            local_678 = (local_620->super_InstanceSymbolBase).super_Symbol.name._M_len;
            pcStack_670 = (local_620->super_InstanceSymbolBase).super_Symbol.name._M_str;
            arg_02._M_len._4_4_ = in_stack_fffffffffffff79c;
            arg_02._M_len._0_4_ = in_stack_fffffffffffff798;
            arg_02._M_str = (char *)in_stack_fffffffffffff7a0;
            Diagnostic::operator<<(in_stack_fffffffffffff790,arg_02);
            local_688 = (local_650->name)._M_len;
            pcStack_680 = (local_650->name)._M_str;
            arg_03._M_len._4_4_ = in_stack_fffffffffffff79c;
            arg_03._M_len._0_4_ = in_stack_fffffffffffff798;
            arg_03._M_str = (char *)in_stack_fffffffffffff7a0;
            Diagnostic::operator<<(in_stack_fffffffffffff790,arg_03);
            break;
          }
          if (local_650->kind == MultiPort) {
            in_stack_fffffffffffff800 =
                 (Compilation *)Symbol::as<slang::ast::MultiPortSymbol>((Symbol *)0x624182);
            local_68c = *(ArgumentDirection *)
                         &(in_stack_fffffffffffff800->options).defaultTimeScale.
                          super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::TimeScale>._M_engaged;
          }
          else {
            in_stack_fffffffffffff7f8 =
                 (SourceLocation)Symbol::as<slang::ast::PortSymbol>((Symbol *)0x6241ad);
            local_68c = *(ArgumentDirection *)((long)in_stack_fffffffffffff7f8 + 0x50);
          }
          if (local_68c == Ref) {
            bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_650->name);
            code = SUB84((ulong)in_stack_fffffffffffff800 >> 0x20,0);
            if (bVar1) {
              local_690 = 0x1f000d;
              local_698 = local_650->location;
              in_stack_fffffffffffff7f0._M_extent_value =
                   (size_t)Scope::addDiag(in_stack_fffffffffffff7f0._M_extent_value,code,
                                          in_stack_fffffffffffff7f8);
              local_6a8 = (local_620->super_InstanceSymbolBase).super_Symbol.name._M_len;
              pcStack_6a0 = (local_620->super_InstanceSymbolBase).super_Symbol.name._M_str;
              arg_04._M_len._4_4_ = in_stack_fffffffffffff79c;
              arg_04._M_len._0_4_ = in_stack_fffffffffffff798;
              arg_04._M_str = (char *)in_stack_fffffffffffff7a0;
              Diagnostic::operator<<(in_stack_fffffffffffff790,arg_04);
            }
            else {
              local_6ac = 0x1e000d;
              local_6b8 = local_650->location;
              Scope::addDiag((Scope *)in_stack_fffffffffffff7f0._M_extent_value,code,
                             in_stack_fffffffffffff7f8);
              local_6c8 = (local_620->super_InstanceSymbolBase).super_Symbol.name._M_len;
              pcStack_6c0 = (local_620->super_InstanceSymbolBase).super_Symbol.name._M_str;
              arg_05._M_len._4_4_ = in_stack_fffffffffffff79c;
              arg_05._M_len._0_4_ = in_stack_fffffffffffff798;
              arg_05._M_str = (char *)in_stack_fffffffffffff7a0;
              Diagnostic::operator<<(in_stack_fffffffffffff790,arg_05);
              local_6d8 = (local_650->name)._M_len;
              pcStack_6d0 = (local_650->name)._M_str;
              arg_06._M_len._4_4_ = in_stack_fffffffffffff79c;
              arg_06._M_len._0_4_ = in_stack_fffffffffffff798;
              arg_06._M_str = (char *)in_stack_fffffffffffff7a0;
              Diagnostic::operator<<(in_stack_fffffffffffff790,arg_06);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
          ::operator++(&local_640);
        }
        __gnu_cxx::
        __normal_iterator<const_slang::ast::InstanceSymbol_*const_*,_std::span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>_>
        ::operator++(&local_610);
      }
    }
    std::
    vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::vector((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
              *)0x624376);
    std::
    vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::size((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
            *)(in_RDI + 0x8d0));
    std::
    vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::reserve(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    local_6f8 = in_RDI + 0x8d0;
    local_700._M_current =
         (DefinitionSymbol **)
         std::
         vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
         ::begin((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                  *)in_stack_fffffffffffff748);
    local_708 = (DefinitionSymbol **)
                std::
                vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                ::end((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                       *)in_stack_fffffffffffff748);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
                        ((__normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
                          *)in_stack_fffffffffffff750,
                         (__normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
                          *)in_stack_fffffffffffff748);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppDVar10 = __gnu_cxx::
                 __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
                 ::operator*(&local_700);
      local_710 = *ppDVar10;
      puVar16 = local_238;
      local_98 = &local_710;
      local_90 = puVar16;
      local_70 = local_98;
      local_68 = puVar16;
      local_78 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
                 ::hash_for<slang::ast::DefinitionSymbol_const*>
                           ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                             *)in_stack_fffffffffffff750,
                            (DefinitionSymbol **)in_stack_fffffffffffff748);
      ppDVar11 = local_70;
      local_18 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                                 *)in_stack_fffffffffffff750,(size_t)in_stack_fffffffffffff748);
      local_10 = ppDVar11;
      local_20 = local_78;
      local_8 = puVar16;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_18);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<const_slang::ast::DefinitionSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                   ::groups((table_arrays<const_slang::ast::DefinitionSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                             *)0x62454f);
        local_40 = local_40 + local_38;
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff758,(size_t)in_stack_fffffffffffff750);
        if (local_44 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<const_slang::ast::DefinitionSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                     ::elements((table_arrays<const_slang::ast::DefinitionSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                                 *)0x6245a4);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            this_01 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                      ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                              *)0x6245f4);
            uVar14 = SUB84(local_10,0);
            uVar15 = (undefined4)((ulong)local_10 >> 0x20);
            ppDVar11 = boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
                       ::key_from<slang::ast::DefinitionSymbol_const*>
                                 ((DefinitionSymbol **)0x62461e);
            bVar1 = std::equal_to<const_slang::ast::DefinitionSymbol_*>::operator()
                              (this_01,(DefinitionSymbol **)CONCAT44(uVar15,uVar14),ppDVar11);
            if (bVar1) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::DefinitionSymbol_*>
              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
              goto LAB_00624725;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar1 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff750,(size_t)in_stack_fffffffffffff748);
        if (bVar1) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::DefinitionSymbol_*>
          ::table_locator(&local_b0);
          goto LAB_00624725;
        }
        bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,*(size_t *)(puVar16 + 8));
      } while (bVar1);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::DefinitionSymbol_*>
      ::table_locator(&local_b0);
LAB_00624725:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                 ::make_iterator((locator *)0x624734);
      boost::unordered::
      unordered_flat_set<const_slang::ast::DefinitionSymbol_*,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
      ::end((unordered_flat_set<const_slang::ast::DefinitionSymbol_*,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
             *)0x6247b9);
      in_stack_fffffffffffff767 =
           boost::unordered::detail::foa::operator==
                     ((table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                       *)in_stack_fffffffffffff750,
                      (table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                       *)in_stack_fffffffffffff748);
      if ((bool)in_stack_fffffffffffff767) {
        std::
        vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
        ::push_back((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                     *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                    (value_type *)in_stack_fffffffffffff758);
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
      ::operator++(&local_700);
    }
    std::
    vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::operator=((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                 *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                (vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                 *)in_stack_fffffffffffff758);
    std::
    vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::~vector((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
               *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
    local_2c0 = 0;
  }
  DiagnosticVisitor::~DiagnosticVisitor((DiagnosticVisitor *)in_stack_fffffffffffff750);
  return;
}

Assistant:

void Compilation::elaborate() {
    SLANG_ASSERT(!isFrozen());

    // Touch every symbol, scope, statement, and expression tree so that
    // we can be sure we have all the diagnostics.
    uint32_t errorLimit = options.errorLimit == 0 ? UINT32_MAX : options.errorLimit;
    DiagnosticVisitor elabVisitor(*this, numErrors, errorLimit);
    getRoot().visit(elabVisitor);

    if (elabVisitor.finishedEarly()) {
        sawFatalError = true;
        return;
    }

    elabVisitor.finalize();

    // Note for the following checks here: anything that depends on a list
    // stored in the compilation object should think carefully about taking
    // a copy of that list first before iterating over it, because your check
    // might trigger additional action that ends up adding to that list,
    // causing undefined behavior.

    // Check all DPI methods for correctness.
    if (!dpiExports.empty() || !elabVisitor.dpiImports.empty())
        checkDPIMethods(elabVisitor.dpiImports);

    // Check extern interface methods for correctness.
    if (!externInterfaceMethods.empty()) {
        auto methods = externInterfaceMethods;
        for (auto method : methods)
            method->connectExternInterfacePrototype();
    }

    if (!elabVisitor.externIfaceProtos.empty())
        checkExternIfaceMethods(elabVisitor.externIfaceProtos);

    if (!elabVisitor.modportsWithExports.empty())
        checkModportExports(elabVisitor.modportsWithExports);

    // Double check any bind directives for correctness. These were already
    // resolved prior to full elaboration but their diagnostics were not
    // issued so we need to check again.
    for (auto [directive, scope] : bindDirectives) {
        ResolvedBind resolvedBind;
        resolveBindTargets(*directive, *scope, resolvedBind);
        checkBindTargetParams(*directive, *scope, resolvedBind);
    }

    // Report any lingering name conflicts.
    if (!nameConflicts.empty()) {
        auto conflicts = nameConflicts;
        for (auto symbol : conflicts) {
            auto scope = symbol->getParentScope();
            SLANG_ASSERT(scope);
            scope->handleNameConflict(*symbol);
        }
    }

    // Report on unused out-of-block definitions. These are always a real error.
    if (!outOfBlockDecls.empty()) {
        auto decls = outOfBlockDecls;
        for (auto& [key, val] : decls) {
            auto& [syntax, name, index, used] = val;
            if (!used) {
                auto& [className, declName, scope] = key;
                auto classRange = name->left->sourceRange();
                auto sym = Lookup::unqualifiedAt(*scope, className,
                                                 LookupLocation(scope, uint32_t(index)),
                                                 classRange);

                if (sym && !declName.empty() && !className.empty()) {
                    if (sym->kind == SymbolKind::ClassType ||
                        sym->kind == SymbolKind::GenericClassDef) {
                        auto& diag = scope->addDiag(diag::NoDeclInClass, name->sourceRange());
                        diag << declName << className;
                    }
                    else {
                        auto& diag = scope->addDiag(diag::NotAClass, classRange);
                        diag << className;
                    }
                }
            }
        }
    }

    // Report on unused config rules.
    if (!configBlocks.empty()) {
        for (auto& [name, confList] : configBlocks) {
            for (auto config : confList) {
                if (config->isUsed)
                    config->checkUnusedRules();
            }
        }
    }

    if (!hasFlag(CompilationFlags::AllowTopLevelIfacePorts)) {
        // Top level instances cannot have interface or ref ports.
        for (auto inst : getRoot().topInstances) {
            for (auto port : inst->body.getPortList()) {
                if (port->kind == SymbolKind::InterfacePort) {
                    inst->body.addDiag(diag::TopModuleIfacePort, port->location)
                        << inst->name << port->name;
                    break;
                }
                else {
                    ArgumentDirection dir;
                    if (port->kind == SymbolKind::MultiPort)
                        dir = port->as<MultiPortSymbol>().direction;
                    else
                        dir = port->as<PortSymbol>().direction;

                    if (dir == ArgumentDirection::Ref) {
                        if (port->name.empty()) {
                            inst->body.addDiag(diag::TopModuleUnnamedRefPort, port->location)
                                << inst->name;
                        }
                        else {
                            inst->body.addDiag(diag::TopModuleRefPort, port->location)
                                << inst->name << port->name;
                        }
                    }
                }
            }
        }
    }

    // Remove definitions from the "unused" set if they were referenced
    // in an interface port somewhere.
    std::vector<const DefinitionSymbol*> newUnreferencedDefs;
    newUnreferencedDefs.reserve(unreferencedDefs.size());
    for (auto def : unreferencedDefs) {
        if (elabVisitor.usedIfacePorts.find(def) == elabVisitor.usedIfacePorts.end())
            newUnreferencedDefs.push_back(def);
    }
    unreferencedDefs = std::move(newUnreferencedDefs);
}